

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurl.cpp
# Opt level: O1

void TPZShapeHCurl<pzshape::TPZShapeTriang>::StaticIndexShapeToVec
               (TPZVec<int> *connectOrder,TPZVec<long> *firstH1ShapeFunc,TPZVec<int> *sidesH1Ord,
               TPZVec<long> *nodeIds,TPZVec<unsigned_int> *shapeCountVec,
               TPZVec<std::pair<int,_long>_> *indexVecShape)

{
  pair<int,_long> *ppVar1;
  long *plVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  MElementType MVar9;
  int *piVar10;
  pair<int,_int> *ppVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iNode;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  TPZManVector<int,_4> transformationIds;
  TPZManVector<int,_4> permutedSideSides;
  TPZVec<std::pair<int,_int>_> funcXY;
  TPZVec<std::pair<int,_int>_> funcY;
  TPZVec<std::pair<int,_int>_> funcX;
  TPZGenMatrix<int> shapeorders;
  TPZManVector<int,_10> firstVfeVec;
  TPZManVector<TPZStack<int,_10>,_10> faceEdges;
  int local_554;
  int local_50c;
  TPZVec<int> local_4e8;
  int local_4c8 [4];
  ulong local_4b8;
  _func_int **local_4b0;
  long local_4a8;
  TPZManVector<int,_10> local_4a0;
  ulong local_458;
  long local_450;
  long local_448;
  TPZVec<std::pair<int,_int>_> local_440;
  TPZVec<std::pair<int,_int>_> local_420;
  TPZVec<std::pair<int,_int>_> local_400;
  TPZGenMatrix<int> local_3e0;
  TPZVec<std::pair<int,_int>_> local_3c8;
  TPZVec<std::pair<int,_int>_> local_3a8;
  TPZVec<std::pair<int,_int>_> local_388;
  TPZManVector<int,_10> local_368;
  TPZManVector<TPZStack<int,_10>,_10> local_320;
  
  uVar4 = pztopology::TPZTriangle::NumSides(2);
  uVar5 = pztopology::TPZTriangle::NumSides(1);
  lVar19 = connectOrder->fNElements;
  uVar14 = 0;
  TPZVec<int>::TPZVec(&local_4e8,0);
  local_4e8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e5370;
  local_4e8.fStore = local_4c8;
  local_4e8.fNElements = 4;
  local_4e8.fNAlloc = 0;
  local_4c8[0] = -1;
  local_4c8[1] = 0xffffffff;
  local_4c8[2] = 0xffffffff;
  local_4c8[3] = 0xffffffff;
  if (0 < lVar19) {
    lVar22 = 0;
    do {
      iVar6 = pztopology::TPZTriangle::GetTransformId((int)lVar22 + 3,nodeIds);
      local_4e8.fStore[lVar22] = iVar6;
      lVar22 = lVar22 + 1;
    } while (lVar19 != lVar22);
  }
  if (0 < (int)uVar5) {
    uVar20 = 0;
    uVar14 = 0;
    do {
      iVar6 = connectOrder->fStore[uVar20];
      iVar8 = (int)uVar20;
      uVar15 = 0;
      do {
        uVar17 = local_4e8.fStore[uVar20] != 0 ^ uVar15;
        iVar7 = pztopology::TPZTriangle::SideNodeLocId(iVar8 + 3,uVar17);
        iVar16 = (int)uVar14;
        ppVar1 = indexVecShape->fStore;
        ppVar1[iVar16 + uVar15].first = uVar17 + iVar8 * 2;
        ppVar1[iVar16 + uVar15].second = (long)iVar7;
        shapeCountVec->fStore[uVar20] = shapeCountVec->fStore[uVar20] + 1;
        uVar15 = uVar15 + 1;
      } while (uVar15 == 1);
      if (iVar6 < 2) {
        uVar15 = iVar16 + uVar15;
      }
      else {
        plVar2 = firstH1ShapeFunc->fStore;
        ppVar1 = indexVecShape->fStore;
        puVar3 = shapeCountVec->fStore;
        iVar7 = 0;
        do {
          uVar17 = iVar16 + uVar15 + iVar7;
          lVar19 = plVar2[uVar20];
          ppVar1[uVar17].first = uVar5 * 2 + iVar8;
          ppVar1[uVar17].second = (long)((int)lVar19 + iVar7);
          puVar3[uVar20] = puVar3[uVar20] + 1;
          iVar7 = iVar7 + 1;
        } while (iVar6 + -1 != iVar7);
        uVar15 = iVar16 + uVar15 + iVar7;
      }
      uVar14 = (ulong)uVar15;
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar5);
  }
  lVar19 = (long)(int)uVar4;
  local_320.super_TPZVec<TPZStack<int,_10>_>._vptr_TPZVec._0_4_ = 0xffffffff;
  TPZManVector<int,_10>::TPZManVector(&local_368,lVar19,(int *)&local_320);
  local_440._vptr_TPZVec = (_func_int **)((ulong)local_440._vptr_TPZVec._4_4_ << 0x20);
  TPZManVector<int,_10>::TPZManVector(&local_4a0,0,(int *)&local_440);
  local_4a0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01841ed8;
  TPZManVector<TPZStack<int,_10>,_10>::TPZManVector
            (&local_320,lVar19,(TPZStack<int,_10> *)&local_4a0);
  TPZManVector<int,_10>::~TPZManVector(&local_4a0);
  *local_368.super_TPZVec<int>.fStore = uVar5 * 3;
  if (0 < (int)uVar4) {
    iVar6 = uVar5 + 3;
    lVar21 = -4;
    lVar22 = 0;
    do {
      pztopology::TPZTriangle::LowerDimensionSides
                (iVar6,(TPZStack<int,_10> *)
                       ((long)((local_320.super_TPZVec<TPZStack<int,_10>_>.fStore)->
                              super_TPZManVector<int,_10>).fExtAlloc + lVar22 + -0x20),1);
      if (lVar22 == 0) {
        iVar8 = *(int *)((long)local_368.super_TPZVec<int>.fStore + lVar21 + 4);
      }
      else {
        iVar8 = *(int *)((long)((local_320.super_TPZVec<TPZStack<int,_10>_>.fStore)->
                               super_TPZManVector<int,_10>).fExtAlloc + lVar22 + -0x58) +
                *(int *)((long)local_368.super_TPZVec<int>.fStore + lVar21);
      }
      *(int *)((long)local_368.super_TPZVec<int>.fStore + lVar21 + 4) = iVar8;
      lVar22 = lVar22 + 0x48;
      lVar21 = lVar21 + 4;
      iVar6 = iVar6 + 1;
    } while ((ulong)uVar4 * 0x48 != lVar22);
  }
  local_4b8 = (ulong)(uint)(local_368.super_TPZVec<int>.fStore[lVar19 + -1] +
                           (int)local_320.super_TPZVec<TPZStack<int,_10>_>.fStore[lVar19 + -1].
                                super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements);
  iVar6 = pzshape::TPZShapeTriang::NShapeF(sidesH1Ord);
  TPZGenMatrix<int>::TPZGenMatrix(&local_3e0,(long)iVar6,3);
  pzshape::TPZShapeTriang::ShapeOrder(nodeIds,sidesH1Ord,&local_3e0);
  if (0 < (int)uVar4) {
    lVar19 = (long)(int)uVar5;
    local_458 = local_4b8 & 0xffffffff;
    local_450 = (long)(int)(uVar4 + uVar5);
    local_4b0 = (_func_int **)&PTR__TPZVec_0183b5b0;
    local_448 = lVar19;
    do {
      TPZVec<int>::TPZVec(&local_4a0.super_TPZVec<int>,0);
      local_4a0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e5370;
      local_4a0.super_TPZVec<int>.fStore = local_4a0.fExtAlloc;
      local_4a0.super_TPZVec<int>.fNElements = 4;
      local_4a0.super_TPZVec<int>.fNAlloc = 0;
      local_4a0.fExtAlloc[0] = -1;
      local_4a0.fExtAlloc[1] = -1;
      local_4a0.fExtAlloc[2] = -1;
      local_4a0.fExtAlloc[3] = -1;
      iVar6 = (int)lVar19 + 3;
      MVar9 = pztopology::TPZTriangle::Type(iVar6);
      if (MVar9 == ETriangle) {
        pztopology::GetPermutation<pztopology::TPZTriangle>
                  (local_4e8.fStore[lVar19],&local_4a0.super_TPZVec<int>);
        iVar8 = connectOrder->fStore[lVar19];
      }
      else {
        if (MVar9 != EQuadrilateral) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "static void TPZShapeHCurl<pzshape::TPZShapeTriang>::StaticIndexShapeToVec(const TPZVec<int> &, const TPZVec<int64_t> &, const TPZVec<int> &, const TPZVec<int64_t> &, TPZVec<unsigned int> &, TPZVec<std::pair<int, int64_t>> &) [TSHAPE = pzshape::TPZShapeTriang]"
                     ,0x103);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," error.",7);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
          std::ostream::put(' ');
          std::ostream::flush();
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHCurl.cpp"
                     ,0x1a8);
        }
        pztopology::GetPermutation<pztopology::TPZQuadrilateral>
                  (local_4e8.fStore[lVar19],&local_4a0.super_TPZVec<int>);
        iVar8 = connectOrder->fStore[lVar19] + 1;
      }
      uVar4 = pztopology::TPZTriangle::NSideNodes(iVar6);
      lVar22 = lVar19 - local_448;
      if (0 < (int)uVar4) {
        uVar20 = 0;
        do {
          iVar16 = local_4a0.super_TPZVec<int>.fStore[uVar20 + uVar4];
          iVar7 = pztopology::TPZTriangle::ContainedSideLocId(iVar6,iVar16);
          if (1 < iVar8) {
            iVar18 = local_368.super_TPZVec<int>.fStore[lVar22];
            plVar2 = firstH1ShapeFunc->fStore;
            ppVar1 = indexVecShape->fStore;
            puVar3 = shapeCountVec->fStore;
            iVar12 = 0;
            do {
              uVar5 = (int)uVar14 + iVar12;
              lVar21 = plVar2[(long)iVar7 + -3];
              ppVar1[uVar5].first = (iVar16 - uVar4) + iVar18;
              ppVar1[uVar5].second = (long)((int)lVar21 + iVar12);
              puVar3[lVar19] = puVar3[lVar19] + 1;
              iVar12 = iVar12 + 1;
            } while (iVar8 + -1 != iVar12);
            uVar14 = (ulong)(uint)((int)uVar14 + iVar12);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar4);
      }
      uVar4 = pzshape::TPZShapeTriang::NConnectShapeF(iVar6,iVar8);
      MVar9 = pztopology::TPZTriangle::Type(iVar6);
      if (MVar9 == EQuadrilateral) {
        iVar6 = local_4e8.fStore[lVar19];
        iVar16 = iVar8 + -2;
        TPZVec<std::pair<int,_int>_>::TPZVec(&local_440,(long)(iVar16 * iVar16 * 2));
        TPZVec<std::pair<int,_int>_>::TPZVec(&local_400,(long)iVar16);
        TPZVec<std::pair<int,_int>_>::TPZVec(&local_420,(long)iVar16);
        if (0 < (int)uVar4) {
          iVar6 = (iVar6 - (iVar6 + 1 >> 0x1f)) + 1;
          iVar16 = iVar6 >> 1;
          iVar16 = iVar16 - (iVar16 - (iVar6 >> 0x1f) & 0xfffffffeU);
          iVar7 = (int)local_458 + (int)lVar22 * 2;
          local_4a8 = local_458 + 1 + lVar22 * 2;
          uVar20 = 0;
          local_50c = 0;
          local_554 = 0;
          iVar6 = 0;
          do {
            lVar21 = firstH1ShapeFunc->fStore[lVar19];
            lVar22 = lVar21 + uVar20;
            piVar10 = TPZGenMatrix<int>::operator()(&local_3e0,lVar22,(long)iVar16);
            iVar18 = (int)lVar21;
            if ((*piVar10 < iVar8) &&
               (piVar10 = TPZGenMatrix<int>::operator()(&local_3e0,lVar22,(ulong)(1 - iVar16)),
               *piVar10 < iVar8)) {
              iVar18 = iVar18 + (int)uVar20;
              local_440.fStore[iVar6].first = iVar7;
              local_440.fStore[iVar6].second = iVar18;
              local_440.fStore[(long)iVar6 + 1].first = (int)local_4a8;
              local_440.fStore[(long)iVar6 + 1].second = iVar18;
              iVar6 = iVar6 + 2;
            }
            else {
              piVar10 = TPZGenMatrix<int>::operator()(&local_3e0,lVar22,(long)iVar16);
              if (*piVar10 < iVar8) {
                ppVar11 = local_400.fStore;
                iVar12 = local_554;
                iVar13 = iVar7;
                local_554 = local_554 + 1;
              }
              else {
                piVar10 = TPZGenMatrix<int>::operator()(&local_3e0,lVar22,(ulong)(1 - iVar16));
                if (iVar8 <= *piVar10) goto LAB_01021895;
                iVar13 = (int)local_4a8;
                ppVar11 = local_420.fStore;
                iVar12 = local_50c;
                local_50c = local_50c + 1;
              }
              ppVar11[iVar12].first = iVar13;
              ppVar11[iVar12].second = iVar18 + (int)uVar20;
            }
LAB_01021895:
            uVar20 = uVar20 + 1;
          } while (uVar4 != uVar20);
        }
        TPZVec<std::pair<int,_int>_>::TPZVec(&local_388,&local_440);
        if (local_388.fNElements != 0) {
          ppVar1 = indexVecShape->fStore;
          puVar3 = shapeCountVec->fStore;
          lVar22 = 0;
          do {
            lVar21 = *(long *)((long)&(local_388.fStore)->first + lVar22);
            ppVar1[uVar14].first = (int)lVar21;
            ppVar1[uVar14].second = lVar21 >> 0x20;
            puVar3[lVar19] = puVar3[lVar19] + 1;
            uVar14 = (ulong)((int)uVar14 + 1);
            lVar22 = lVar22 + 8;
          } while (local_388.fNElements << 3 != lVar22);
        }
        local_388._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018e53c8;
        if (local_388.fStore != (pair<int,_int> *)0x0) {
          operator_delete__(local_388.fStore);
        }
        TPZVec<std::pair<int,_int>_>::TPZVec(&local_3a8,&local_400);
        if (local_3a8.fNElements != 0) {
          ppVar1 = indexVecShape->fStore;
          puVar3 = shapeCountVec->fStore;
          lVar22 = 0;
          do {
            lVar21 = *(long *)((long)&(local_3a8.fStore)->first + lVar22);
            ppVar1[uVar14].first = (int)lVar21;
            ppVar1[uVar14].second = lVar21 >> 0x20;
            puVar3[lVar19] = puVar3[lVar19] + 1;
            uVar14 = (ulong)((int)uVar14 + 1);
            lVar22 = lVar22 + 8;
          } while (local_3a8.fNElements << 3 != lVar22);
        }
        local_3a8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018e53c8;
        if (local_3a8.fStore != (pair<int,_int> *)0x0) {
          operator_delete__(local_3a8.fStore);
        }
        TPZVec<std::pair<int,_int>_>::TPZVec(&local_3c8,&local_420);
        if (local_3c8.fNElements != 0) {
          ppVar1 = indexVecShape->fStore;
          puVar3 = shapeCountVec->fStore;
          lVar22 = 0;
          do {
            lVar21 = *(long *)((long)&(local_3c8.fStore)->first + lVar22);
            ppVar1[uVar14].first = (int)lVar21;
            ppVar1[uVar14].second = lVar21 >> 0x20;
            puVar3[lVar19] = puVar3[lVar19] + 1;
            uVar14 = (ulong)((int)uVar14 + 1);
            lVar22 = lVar22 + 8;
          } while (local_3c8.fNElements << 3 != lVar22);
        }
        local_3c8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018e53c8;
        if (local_3c8.fStore != (pair<int,_int> *)0x0) {
          operator_delete__(local_3c8.fStore);
        }
        local_420._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018e53c8;
        if (local_420.fStore != (pair<int,_int> *)0x0) {
          operator_delete__(local_420.fStore);
        }
        local_400._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018e53c8;
        if (local_400.fStore != (pair<int,_int> *)0x0) {
          operator_delete__(local_400.fStore);
        }
        local_440._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018e53c8;
        if (local_440.fStore != (pair<int,_int> *)0x0) {
          operator_delete__(local_440.fStore);
        }
      }
      else if (0 < (int)uVar4) {
        plVar2 = firstH1ShapeFunc->fStore;
        ppVar1 = indexVecShape->fStore;
        puVar3 = shapeCountVec->fStore;
        uVar5 = uVar4 * 2;
        if ((int)(uVar4 * 2) < 2) {
          uVar5 = 1;
        }
        uVar20 = 0;
        do {
          uVar4 = (uint)uVar20;
          uVar15 = (int)uVar14 + uVar4;
          lVar21 = plVar2[lVar19];
          ppVar1[uVar15].first = (uVar4 & 1) + (int)local_4b8 + (int)lVar22 * 2;
          ppVar1[uVar15].second = (uVar20 >> 1) + lVar21;
          puVar3[lVar19] = puVar3[lVar19] + 1;
          uVar4 = uVar4 + 1;
          uVar20 = (ulong)uVar4;
        } while (uVar5 != uVar4);
        uVar14 = (ulong)((int)uVar14 + uVar4);
      }
      if (local_4a0.super_TPZVec<int>.fStore == local_4a0.fExtAlloc) {
        local_4a0.super_TPZVec<int>.fStore = (int *)0x0;
      }
      local_4a0.super_TPZVec<int>.fNAlloc = 0;
      local_4a0.super_TPZVec<int>._vptr_TPZVec = local_4b0;
      if (local_4a0.super_TPZVec<int>.fStore != (int *)0x0) {
        operator_delete__(local_4a0.super_TPZVec<int>.fStore);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < local_450);
  }
  TPZGenMatrix<int>::~TPZGenMatrix(&local_3e0);
  TPZManVector<TPZStack<int,_10>,_10>::~TPZManVector(&local_320);
  TPZManVector<int,_10>::~TPZManVector(&local_368);
  if (local_4e8.fStore == local_4c8) {
    local_4e8.fStore = (int *)0x0;
  }
  local_4e8.fNAlloc = 0;
  local_4e8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_4e8.fStore != (int *)0x0) {
    operator_delete__(local_4e8.fStore);
  }
  return;
}

Assistant:

void TPZShapeHCurl<TSHAPE>::StaticIndexShapeToVec(const TPZVec<int>& connectOrder,
                                                  const TPZVec<int64_t>& firstH1ShapeFunc,
                                                  const TPZVec<int>& sidesH1Ord,
                                                  const TPZVec<int64_t>& nodeIds,
                                                  TPZVec<unsigned int>& shapeCountVec,
                                                  TPZVec<std::pair<int,int64_t>> & indexVecShape
                                                  ) {



    //                                                  TPZVec<std::pair<int,int64_t>> & indexVecShape,
    //                                                       const TPZVec<int>& connectOrder,
    //                                                       const TPZVec<int64_t>& firstH1ShapeFunc,
    //                                                       const TPZVec<int>& sidesH1Ord,
    //                                                       TPZVec<unsigned int>& shapeCountVec,
    //                                                       const TPZVec<int64_t>& nodeIds) {
    /******************************************************************************************************************
     * The directions are calculated based on the LOCAL side ids (and SideNodeLocId), such as the H1 shape functions.
     * For instance, for the triangle, the vectors are:
     * vea30 vea31 vea41 vea42 vea52 vea51 vet3 vet4 vet5 vfe63 vfe64 vfe65 vft1 vft2
     * and the shapes will be organized as follows:
     * phi0 phi1 phi2  phi31 phi32 ... phi3i   phi41 phi42 ... phi4j   phi51 phi52 ... phi5k   phi61 phi62 ... phi6n
     *^^^^^^^^^^^^^^^  ^^^^^^^^^^^^^^^^^^^^^   ^^^^^^^^^^^^^^^^^^^^^   ^^^^^^^^^^^^^^^^^^^^^   ^^^^^^^^^^^^^^^^^^^^^
     *  corner funcs       edge 3 funcs            edge 4 funcs            edge 5 funcs            internal funcs
     *
     * In order to ensure that the functions will coincide in two neighbouring elements, they will be then sorted by
     * their sides' GLOBAL ids instead of their LOCAL ids
     ******************************************************************************************************************/

    
    const auto nFaces = TSHAPE::Dimension < 2 ? 0 : TSHAPE::NumSides(2);
    const auto nEdges = TSHAPE::NumSides(1);
    constexpr auto nNodes = TSHAPE::NCornerNodes;

    const auto nConnects = connectOrder.size();
    TPZManVector<int, TSHAPE::NSides - nNodes>
        transformationIds(TSHAPE::NSides - nNodes, -1);
    //computing transformation id for sides.
    for (auto iCon = 0; iCon < nConnects; iCon++) {
        transformationIds[iCon] = TSHAPE::GetTransformId(nNodes + iCon, nodeIds);
    }
    
    unsigned int shapeCount = 0;


    //calculates edge functions
    for (auto iCon = 0; iCon < nEdges; iCon++) {
        const auto pOrder = connectOrder[iCon];
        //there will be 2 + pOrder - 1 = pOrder + 1 functions for each edge

        for (auto iNode = 0; iNode < 2; iNode++) {
            auto whichNode = transformationIds[iCon] == 0 ? iNode : (iNode + 1) % 2;
            const int vecIndex = iCon * 2 + whichNode;
            const int64_t shapeIndex = TSHAPE::SideNodeLocId(iCon + nNodes, whichNode);
            indexVecShape[shapeCount] = std::make_pair(vecIndex, shapeIndex);
            shapeCount++;
            shapeCountVec[iCon]++;
        }//phi^ea funcs
        const int vecIndex = nEdges * 2 + iCon;
        for (int iEdgeInternal = 0; iEdgeInternal < pOrder - 1; iEdgeInternal++) {
            const int shapeIndex = firstH1ShapeFunc[iCon] + iEdgeInternal;
            indexVecShape[shapeCount] = std::make_pair(vecIndex, shapeIndex);
            shapeCount++;
            shapeCountVec[iCon]++;
        }//phi^et funcs
    }

    const int firstFaceShape = shapeCount;

#ifdef PZ_LOG2
    if (logger.isDebugEnabled()) {
        std::ostringstream sout;
        sout << __PRETTY_FUNCTION__ << '\n'
             << " n shape funcs (edge connects): "<<shapeCount<<'\n';
        //thats way too much info, uncomment if needed
        
        // sout << "vec shape index (edge connects):" << std::endl;
        // for (int iShape = 0; iShape < firstFaceShape; iShape++) {
        //     auto pair = indexVecShape[iShape];
        //     sout << "\tvec: " << pair.first << "\tshape: " << pair.second << std::endl;
        // }
        LOGPZ_DEBUG(logger, sout.str())
            }
#endif
    if(TSHAPE::Dimension < 2) return;
    /**
     * In order to ease the calculation of the indexes, these structures will store, respectively:
     * a) firstVfeVec the first Vfe vector for each face
     * b) faceEdges the edges contained in a certain face
     * c) firstVftVec the first Vft vector. Then, it is firstVftVec + 2*iFace + iVec
     * d) firstVfOrthVec the first VfOrthVec. Then, it is firstVfOrthVec + iFace
     */
    TPZManVector<int> firstVfeVec(nFaces,-1);
    TPZManVector<TPZStack<int>> faceEdges(nFaces,TPZStack<int>(0,0));
    {
        //we skip v^{e,a} and v^{e,T} vectors
        const int nEdgeVectors = nEdges * 3;
        firstVfeVec[0] = nEdgeVectors;
        for(auto iFace = 0; iFace < nFaces; iFace++){
            TSHAPE::LowerDimensionSides(iFace + nEdges + nNodes, faceEdges[iFace], 1);
            const int nFaceEdges = iFace == 0 ? 0 : faceEdges[iFace-1].size();
            firstVfeVec[iFace] = iFace == 0 ?
                firstVfeVec[iFace] : firstVfeVec[iFace - 1] + nFaceEdges;
        }
    }
    const int firstVftVec = firstVfeVec[nFaces-1] + faceEdges[nFaces-1].size();
    const int firstVfOrthVec = firstVftVec + 2 * nFaces;

    const int nH1Funcs = TSHAPE::NShapeF(sidesH1Ord);
    TPZGenMatrix<int> shapeorders(nH1Funcs,3);
    TSHAPE::ShapeOrder(nodeIds,sidesH1Ord, shapeorders);
    
    for(auto iCon = nEdges; iCon < nEdges + nFaces; iCon++){
        const auto iSide = iCon + nNodes;
        const auto iFace = iCon - nEdges;

        int h1FaceOrder = -1;
        TPZManVector<int,4> permutedSideSides(4,-1);
        
        switch(TSHAPE::Type(iSide)){
        case ETriangle://triangular face
            pztopology::GetPermutation<pztopology::TPZTriangle>(transformationIds[iCon],
                                                                permutedSideSides);
            h1FaceOrder = connectOrder[iCon];
            break;
        case EQuadrilateral://quadrilateral face
            pztopology::GetPermutation<pztopology::TPZQuadrilateral>(transformationIds[iCon],
                                                                     permutedSideSides);
            h1FaceOrder = connectOrder[iCon]+1;
            break;
        default:
            PZError<<__PRETTY_FUNCTION__<<" error."<<std::endl;
            DebugStop();
        }
#ifdef PZ_LOG2
        if (logger.isDebugEnabled()) {
            std::ostringstream sout;
            sout << "face :"<< iSide <<" permutation:"<< std::endl;
            for (auto i = 0; i < permutedSideSides.size(); i++) sout << permutedSideSides[i]<<"\t";
            sout<<std::endl;
            sout<<"transformation id:"<<transformationIds[iCon]<<std::endl;
            LOGPZ_DEBUG(logger, sout.str())
                }
#endif


        const int nFaceNodes = TSHAPE::NSideNodes(iSide);
        //this is not a mistake, since for faces nEdges = nNodes
        const int &nFaceEdges = nFaceNodes;

        //first the phi Fe functions
        for(auto iEdge = 0; iEdge < nFaceEdges; iEdge++ ){
            const auto currentLocalEdge = permutedSideSides[iEdge+nFaceNodes];
            const auto currentEdge = TSHAPE::ContainedSideLocId(iSide, currentLocalEdge);
            const auto vecIndex = firstVfeVec[iFace] + currentLocalEdge - nFaceNodes;
            
            for(auto iEdgeInternal = 0; iEdgeInternal < h1FaceOrder - 1; iEdgeInternal++){
                const int shapeIndex = firstH1ShapeFunc[currentEdge - nNodes] + iEdgeInternal;
                indexVecShape[shapeCount] = std::make_pair(vecIndex,shapeIndex);
                shapeCount++;
                shapeCountVec[iCon]++;
            }
        }

        const auto nVfeFuncs = shapeCountVec[iCon];
        
        /**now the phi Fi functions
           They are calculated differently for quad and triangular faces.
           For triangular faces, all the face functions of order k are taken,
           and each is multiplied by each of the tangent vectors associated with
           the face.
           For quadrilateral faces, the face functions of order k+1 are taken:
           since we are interested in the Q_{k,k+1}\times Q_{k+1,k} space,
           we check their orders.*/
        
        //number of h1 face funcs
        const auto nH1FaceFuncs =
            TSHAPE::NConnectShapeF(iSide,h1FaceOrder);
        
        const auto quadFace = TSHAPE::Type(iSide) == EQuadrilateral;
        
        if(quadFace){
            const auto transid = transformationIds[iCon];
            /*
              transformation id is 0 or 1 if starting at node 0
              transformation id is 2 or 3 if starting at node 1
              transformation id is 4 or 5 if starting at node 2
              transformation id is 6 or 7 if starting at node 3
              even numbers are counterclockwise dir,
              odd numbers are clockwise direction
              so ids 0, 3, 4, 7 have x as first dir
              and 1, 2, 5, 6 have y as first dir.

              we know that the vft vectors are created
              such that the first one is in x and the second one
              is in y (local face coordinates).
              therefore, we need the variables in the h1 functions
              to match.
              warning: sketchy integer arithmetic will follow:
             */
            const auto xdir = ((transid+1)/2)%2;//i told you so
            const auto ydir = 1-xdir;

            const auto hCurlFaceOrder = h1FaceOrder-1;
            const auto nfuncsk = 2 * (hCurlFaceOrder - 1) * (hCurlFaceOrder - 1);
            const auto nfuncsk1 = hCurlFaceOrder - 1;
            TPZVec<std::pair<int,int>> funcXY(nfuncsk);
            TPZVec<std::pair<int,int>> funcX(nfuncsk1);
            TPZVec<std::pair<int,int>> funcY(nfuncsk1);
            int countxy{0}, countx{0},county{0};
            /**now we assume that the first vft vec is in the x direction
               and that the next one is in the y direction.*/
            const int vecindex[] = {firstVftVec + 2*iFace,firstVftVec + 2*iFace+1};
            for(auto iFunc = 0; iFunc < nH1FaceFuncs; iFunc++ ){
                const auto shapeIndex = firstH1ShapeFunc[iCon] + iFunc;

                //functions of degree k
                if((shapeorders(shapeIndex,xdir) <= hCurlFaceOrder) &&
                   (shapeorders(shapeIndex,ydir) <= hCurlFaceOrder)){
                    funcXY[countxy++] = {vecindex[0],shapeIndex};
                    funcXY[countxy++] = {vecindex[1],shapeIndex};
                }else if(shapeorders(shapeIndex,xdir) <= hCurlFaceOrder){
                    funcX[countx++] = {vecindex[0],shapeIndex};
                }else if(shapeorders(shapeIndex,ydir) <= hCurlFaceOrder){
                    funcY[county++] = {vecindex[1],shapeIndex};
                }
            }

            auto AddFromVec = [&indexVecShape,&shapeCountVec, &shapeCount,iCon]
                (TPZVec<std::pair<int,int>> myvec){
                for(auto [vi,si] : myvec){
                    indexVecShape[shapeCount] = std::make_pair(vi,si);
                    shapeCount++;
                    shapeCountVec[iCon]++;
                }
            };
            AddFromVec(funcXY);
            AddFromVec(funcX);
            AddFromVec(funcY);
            
        }
        else{
            //ok that one is easy to guess
            const auto nFaceInternalFuncs =
                2 * nH1FaceFuncs;
            for(auto iFunc = 0; iFunc < nFaceInternalFuncs; iFunc++ ){
                //it should alternate between them
                const auto vecIndex = firstVftVec + 2*iFace + iFunc % 2;
                //they should repeat
                const auto shapeIndex = firstH1ShapeFunc[iCon] + iFunc / 2;
                indexVecShape[shapeCount] = std::make_pair(vecIndex,shapeIndex);
                shapeCount++;
                shapeCountVec[iCon]++;
            }
        }

        const auto nVfiFuncs = shapeCountVec[iCon] - nVfeFuncs;
#ifdef PZ_LOG2
        if (logger.isDebugEnabled()) {
            std::ostringstream sout;
            sout << "iFace: "<<iFace<<' '
                 << "nVfeFuncs: "<< nVfeFuncs <<' '
                 << "nVfiFuncs: "<< nVfiFuncs << '\n';
            LOGPZ_DEBUG(logger, sout.str())
                }
#endif
    }

#ifdef PZ_LOG2
    if (logger.isDebugEnabled()) {
        std::ostringstream sout;
        sout << "n shape funcs (face connects): "
             << firstInternalShape - firstFaceShape << '\n';
        //way too much info, uncomment if needed
        // sout << "vec shape index (face connects):" << std::endl;
        // for (int iShape = firstFaceShape; iShape < firstInternalShape; iShape++) {
        //     auto pair = indexVecShape[iShape];
        //     sout << "\tvec: " << pair.first << "\tshape: " << pair.second << std::endl;
        // }
        LOGPZ_DEBUG(logger, sout.str())
            }
#endif

    if(TSHAPE::Dimension < 3) return;

    const int firstInternalShape = shapeCount;
    
    const int iCon = nEdges + nFaces;
    //hcurl connect order
    const auto sideOrder = connectOrder[iCon];
    //first, the phi KF functions
    for(int iFace = 0; iFace < nFaces; iFace++){
        const auto faceSide = iFace + nEdges + nNodes;
        const auto faceType = TSHAPE::Type(faceSide);
        const auto faceDim = TSHAPE::SideDimension(faceSide);
        const auto faceOrderH1 =
            TSHAPE::Type() == EPrisma || TSHAPE::Type() == ECube ?
            sideOrder + 1 : sideOrder;
        const auto nH1FaceFuncs =
            TSHAPE::NConnectShapeF(faceSide,faceOrderH1);
        const auto vecIndex = firstVfOrthVec + iFace;

        for(auto iFunc = 0; iFunc < nH1FaceFuncs; iFunc++ ){
            const auto shapeIndex = firstH1ShapeFunc[nEdges + iFace] + iFunc;

            bool skip = false;
            if constexpr(TSHAPE::Type() == EPrisma){
                const int ordvec[] =
                    {shapeorders(shapeIndex,0),shapeorders(shapeIndex,1)};
                skip = true;
                if((TSHAPE::Type(faceSide) == EQuadrilateral) &&
                   (ordvec[0] <= sideOrder) &&
                   (ordvec[1] <= sideOrder+1)){
                    //for quad faces ordvec[0] = xord and ordvec[1] = zord
                    skip = false;
                    
                }
                else if(TSHAPE::Type(faceSide) == ETriangle){
                    skip = false;
                }
            }
            if(!skip){
                indexVecShape[shapeCount] = std::make_pair(vecIndex,shapeIndex);
                shapeCount++;
                shapeCountVec[iCon]++;
            }
        }   
    }

    const auto nKfFuncs = shapeCount - firstInternalShape;

    const auto h1InternalOrd = sidesH1Ord[nEdges+nFaces];
    //now the phi Ki funcs
    const int firstInternalVec = firstVfOrthVec + nFaces;
    //ALL H1 internal functions
    const auto nH1Internal =
        TSHAPE::NConnectShapeF(TSHAPE::NSides - 1, h1InternalOrd);

    const auto xVecIndex = firstInternalVec + 0;
    const auto yVecIndex = firstInternalVec + 1;
    const auto zVecIndex = firstInternalVec + 2;

    auto addFunc = [&indexVecShape,&shapeCount,&shapeCountVec,iCon](
      int vIndex, int sIndex){
        indexVecShape[shapeCount] = std::make_pair(vIndex, sIndex);
        shapeCount++;
        shapeCountVec[iCon]++;
    };
    /**in order to filter the gradients of hcurl functions,
       we need to sort the shape functions for the hexahedral el*/
    auto AddToVec = [](TPZVec<std::pair<int,int>> &v,std::pair<int,int> vs){
        const auto vi = v.size();
        v.Resize(vi+1);
        v[vi] = vs;
    };

    TPZVec<std::pair<int,int>> funcXYZ, funcX, funcY, funcZ;
    
    
    for(auto iFunc = 0; iFunc < nH1Internal; iFunc++ ){
        const auto shapeIndex = firstH1ShapeFunc[iCon] + iFunc;
        const int xord = shapeorders(shapeIndex,0);
        const int yord = shapeorders(shapeIndex,1);
        const int zord = shapeorders(shapeIndex,2);
        if constexpr(TSHAPE::Type() == ECube){
            if(xord <= sideOrder && yord <= sideOrder && zord <= sideOrder){
                AddToVec(funcXYZ, std::make_pair(xVecIndex,shapeIndex));
                AddToVec(funcXYZ, std::make_pair(yVecIndex,shapeIndex));
                AddToVec(funcXYZ, std::make_pair(zVecIndex,shapeIndex));
            }
            else{
                if(xord <= sideOrder){
                    AddToVec(funcX, std::make_pair(xVecIndex,shapeIndex));
                }
                if(yord <= sideOrder){
                    AddToVec(funcY, std::make_pair(yVecIndex,shapeIndex));
                }
                if(zord <= sideOrder){
                    AddToVec(funcZ, std::make_pair(zVecIndex,shapeIndex));
                }
            }
        }
        else if constexpr(TSHAPE::Type() == EPrisma){
            if((xord <= sideOrder) &&
               (yord <= sideOrder) &&
               (zord <= sideOrder+1)){
                addFunc(xVecIndex,shapeIndex);
                addFunc(yVecIndex,shapeIndex);
            }
            if((xord <= sideOrder+1) &&
               (yord <= sideOrder+1) &&
               (zord <= sideOrder)){
                addFunc(zVecIndex,shapeIndex);
            }
        }
        else{
            addFunc(xVecIndex,shapeIndex);
            addFunc(yVecIndex,shapeIndex);
            addFunc(zVecIndex,shapeIndex);
        }
    }
    //now we actually add the functions
    if constexpr(TSHAPE::Type() == ECube){
        for(auto [v,s] : funcXYZ){
            addFunc(v,s);
        }
        for(auto [v,s] : funcX){
            addFunc(v,s);
        }
        for(auto [v,s] : funcY){
            addFunc(v,s);
        }
        for(auto [v,s] : funcZ){
            addFunc(v,s);
        }
    }
    
    if(shapeCount != indexVecShape.size()){
        DebugStop();
    }
#ifdef PZ_LOG2
    if (logger.isDebugEnabled()) {
        const auto nInternalFuncs = shapeCount - firstInternalShape;
        const auto nKiFuncs = nInternalFuncs - nKfFuncs;
        std::ostringstream sout;
        sout << "n shape funcs (internal connect): "
             << shapeCount - firstInternalShape << '\n'
             << "\t n kf funcs : " << nKfFuncs
             << "\t n ki funcs : " << nKiFuncs << '\n';
        LOGPZ_DEBUG(logger, sout.str())
            }
#endif
}